

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osstzprs.c
# Opt level: O1

char * parse_digits(int *val,char *p,size_t *len)

{
  int iVar1;
  ushort **ppuVar2;
  
  *val = 0;
  if (*len != 0) {
    ppuVar2 = __ctype_b_loc();
    do {
      if ((*(byte *)((long)*ppuVar2 + (long)*p * 2 + 1) & 8) == 0) {
        return p;
      }
      iVar1 = *val;
      *val = iVar1 * 10;
      *val = iVar1 * 10 + (int)*p + -0x30;
      p = p + 1;
      *len = *len - 1;
    } while (*len != 0);
  }
  return p;
}

Assistant:

static const char *parse_digits(int *val, const char *p, size_t *len)
{
    for (*val = 0 ; *len != 0 && isdigit(*p) ; ++p, --*len)
    {
        *val *= 10;
        *val += *p - '0';
    }
    return p;
}